

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player.cc
# Opt level: O2

char * Player::chip_name(Player_Type pt)

{
  if (pt == OPL3) {
    return "YMF262";
  }
  if (pt == OPN2) {
    return "YM2612";
  }
  __assert_fail("false",
                "/workspace/llm4binary/github/license_c_cmakelists/jpcima[P]adljack/sources/player.cc"
                ,0x33,"static const char *Player::chip_name(Player_Type)");
}

Assistant:

const char *Player::chip_name(Player_Type pt)
{
    switch (pt) {
    default: assert(false); abort();
    #define PLAYER_CASE(x)                                                  \
        case Player_Type::x: return Player_Traits<Player_Type::x>::chip_name();
    EACH_PLAYER_TYPE(PLAYER_CASE);
    #undef PLAYER_CASE
    }
}